

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O3

int cat(int argc,char **argv)

{
  char *__s1;
  pointer ppVar1;
  pointer ppVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  pointer ppVar6;
  undefined1 uVar7;
  int iVar8;
  uint uVar9;
  Allocator alloc;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  Point2i p;
  Point2i p_00;
  pair<pbrt::Point2<int>,_pbrt::ImageChannelValues> *v_1;
  Tuple2<pbrt::Point2,_int> p_01;
  long *plVar13;
  int iVar14;
  undefined8 uVar15;
  memory_resource *pmVar16;
  anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
  *paVar17;
  uint uVar18;
  __normal_iterator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_*,_std::vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>_>
  __i;
  ulong uVar19;
  undefined8 uVar20;
  pointer ppVar21;
  Tuple2<pbrt::Point2,_int> TVar22;
  uint uVar23;
  long lVar24;
  long *plVar25;
  int va;
  int iStack_2fc;
  undefined1 local_2f8 [32];
  ulong local_2d8;
  size_t local_2d0;
  long *local_2c8;
  uint local_2bc;
  vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
  sorted;
  TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
  local_288;
  polymorphic_allocator<float> local_280;
  ImageChannelValues v;
  ImageAndMetadata im;
  
  if (argc == 0) {
    usage("cat","no filenames provided to \"cat\"?");
  }
  if (0 < argc) {
    uVar23 = 1;
    uVar11 = 0;
    bVar3 = false;
    bVar5 = false;
    bVar4 = false;
    do {
      __s1 = argv[uVar11];
      iVar8 = strcmp(__s1,"--sort");
      if ((iVar8 == 0) || (iVar8 = strcmp(__s1,"-sort"), iVar8 == 0)) {
        bVar3 = (bool)(bVar3 ^ 1);
      }
      else {
        iVar8 = strcmp(__s1,"--csv");
        if ((iVar8 == 0) || (iVar8 = strcmp(__s1,"-csv"), iVar8 == 0)) {
          bVar5 = (bool)(bVar5 ^ 1);
        }
        else {
          iVar8 = strcmp(__s1,"--list");
          if ((iVar8 == 0) || (iVar8 = strcmp(__s1,"-list"), iVar8 == 0)) {
            bVar4 = (bool)(bVar4 ^ 1);
          }
          else {
            if (bVar3) {
              if (bVar5) {
                cat();
                return uVar23;
              }
              if (bVar4) {
                cat();
                return uVar23;
              }
            }
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&va,__s1,(allocator<char> *)&v);
            alloc.memoryResource = pstd::pmr::new_delete_resource();
            local_288.bits = 0;
            pbrt::Image::Read(&im,(string *)&va,alloc,(ColorEncodingHandle *)&local_288);
            if (_va != local_2f8 + 8) {
              operator_delete(_va,local_2f8._8_8_ + 1);
            }
            uVar23 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>.x;
            uVar19 = 0;
            if (0 < (int)uVar23) {
              uVar19 = (ulong)im.image.resolution.super_Tuple2<pbrt::Point2,_int> & 0xffffffff;
            }
            uVar12 = im.image.resolution.super_Tuple2<pbrt::Point2,_int>.y;
            uVar10 = 0;
            if (uVar12 != 0 && -1 < (long)im.image.resolution.super_Tuple2<pbrt::Point2,_int>) {
              uVar10 = (ulong)uVar12;
            }
            uVar15 = im.metadata.pixelBounds.optionalValue._0_8_;
            uVar20 = im.metadata.pixelBounds.optionalValue._8_8_;
            if (im.metadata.pixelBounds.set == false) {
              uVar15 = (long *)CONCAT44((int)uVar12 >> 0x1f & uVar12,(int)uVar23 >> 0x1f & uVar23);
              uVar20 = uVar19 | uVar10 << 0x20;
            }
            uVar12 = (uint)uVar20;
            iVar8 = (int)uVar15;
            uVar18 = (uint)((ulong)uVar20 >> 0x20);
            uVar23 = (uint)((ulong)uVar15 >> 0x20);
            local_2c8 = (long *)uVar15;
            if (bVar3) {
              uVar19 = (ulong)uVar15 >> 0x20;
              sorted.
              super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
              sorted.
              super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
              ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
              sorted.
              super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
              std::
              vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
              ::reserve(&sorted,(long)(int)((uVar18 - uVar23) * (uVar12 - iVar8)));
              uVar9 = uVar18;
              if ((int)uVar18 < (int)uVar23) {
                uVar9 = uVar23;
              }
              if ((iVar8 < (int)uVar12) && ((int)uVar23 < (int)uVar18)) {
                uVar10 = uVar15 & 0xffffffff;
                plVar13 = (long *)(uVar15 & 0xffffffff);
                plVar25 = (long *)uVar15;
                do {
                  p.super_Tuple2<pbrt::Point2,_int>.x = (int)plVar13 - (int)uVar15;
                  p.super_Tuple2<pbrt::Point2,_int>.y = (int)uVar19 - uVar23;
                  pbrt::Image::GetChannels
                            ((ImageChannelValues *)
                             &v.
                              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                             ,&im.image,p,(WrapMode2D)0x200000002);
                  _va = (pointer)plVar25;
                  local_280.memoryResource = pstd::pmr::new_delete_resource();
                  pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::
                  InlinedVector((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *
                                )local_2f8,
                                &v.
                                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                ,&local_280);
                  std::
                  vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>
                  ::emplace_back<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>
                            ((vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>
                              *)&sorted,(pair<pbrt::Point2<int>,_pbrt::ImageChannelValues> *)&va);
                  uVar15 = local_2c8;
                  local_2d0 = 0;
                  (*(*(_func_int ***)local_2f8._0_8_)[3])
                            (local_2f8._0_8_,local_2f8._8_8_,local_2d8 << 2,4);
                  v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.nStored
                       = 0;
                  (**(code **)(*(long *)CONCAT44(v.
                                                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                                 .alloc.memoryResource._4_4_,
                                                 v.
                                                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                                 .alloc.memoryResource._0_4_) + 0x18))
                            ((long *)CONCAT44(v.
                                              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                              .alloc.memoryResource._4_4_,
                                              v.
                                              super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                              .alloc.memoryResource._0_4_),
                             v.
                             super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                             .ptr,v.
                                  super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                  .nAlloc << 2,4);
                  uVar18 = (int)plVar13 + 1;
                  plVar13 = (long *)(((ulong)plVar25 & 0xffffffff00000000) + 0x100000000 | uVar10);
                  if (uVar18 != uVar12) {
                    plVar13 = (long *)((ulong)plVar25 & 0xffffffff00000000 | (ulong)uVar18);
                  }
                  uVar19 = (ulong)plVar13 >> 0x20;
                  plVar25 = plVar13;
                } while (((int)uVar15 != (int)plVar13) || (uVar9 != (uint)((ulong)plVar13 >> 0x20)))
                ;
              }
              ppVar6 = sorted.
                       super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              ppVar1 = sorted.
                       super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
              ppVar2 = sorted.
                       super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish;
              if (sorted.
                  super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                  ._M_impl.super__Vector_impl_data._M_start !=
                  sorted.
                  super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
                lVar24 = (long)sorted.
                               super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                         (long)sorted.
                               super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                               ._M_impl.super__Vector_impl_data._M_start;
                std::
                __introsort_loop<__gnu_cxx::__normal_iterator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>*,std::vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<cat(int,char**)::__0>>
                          (sorted.
                           super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                           ._M_impl.super__Vector_impl_data._M_start,
                           sorted.
                           super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish,
                           (int)LZCOUNT((lVar24 >> 3) * 0x6db6db6db6db6db7) * 2 ^ 0x7e);
                if (lVar24 < 0x381) {
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>*,std::vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>>,__gnu_cxx::__ops::_Iter_comp_iter<cat(int,char**)::__0>>
                            (ppVar1,ppVar6);
                  ppVar1 = sorted.
                           super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                           ._M_impl.super__Vector_impl_data._M_start;
                  ppVar2 = sorted.
                           super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish;
                }
                else {
                  ppVar21 = ppVar1 + 0x10;
                  std::
                  __insertion_sort<__gnu_cxx::__normal_iterator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>*,std::vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>>,__gnu_cxx::__ops::_Iter_comp_iter<cat(int,char**)::__0>>
                            (ppVar1,ppVar21);
                  for (; ppVar1 = sorted.
                                  super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start,
                      ppVar2 = sorted.
                               super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish, ppVar21 != ppVar6;
                      ppVar21 = ppVar21 + 1) {
                    std::
                    __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>*,std::vector<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>,std::allocator<std::pair<pbrt::Point2<int>,pbrt::ImageChannelValues>>>>,__gnu_cxx::__ops::_Val_comp_iter<cat(int,char**)::__0>>
                              (ppVar21);
                  }
                }
              }
              for (; ppVar6 = sorted.
                              super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                              ._M_impl.super__Vector_impl_data._M_finish,
                  ppVar1 != sorted.
                            super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                            ._M_impl.super__Vector_impl_data._M_finish; ppVar1 = ppVar1 + 1) {
                sorted.
                super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
                if (!bVar5) {
                  printf("(%d, %d): ",(ulong)(uint)(ppVar1->first).super_Tuple2<pbrt::Point2,_int>.x
                         ,(ulong)(uint)(ppVar1->first).super_Tuple2<pbrt::Point2,_int>.y);
                }
                uVar19 = (ppVar1->second).
                         super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                         nStored;
                if (uVar19 != 0) {
                  lVar24 = 0;
                  uVar10 = 0;
                  do {
                    paVar17 = (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                               *)(ppVar1->second).
                                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                 .ptr;
                    if (paVar17 ==
                        (anon_union_16_1_a7e8d694_for_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>_5
                         *)0x0) {
                      paVar17 = &(ppVar1->second).
                                 super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                                 .field_2;
                    }
                    uVar7 = 0x2c;
                    if (uVar10 == uVar19 - 1) {
                      uVar7 = 10;
                    }
                    va._0_1_ = uVar7;
                    pbrt::Printf<float_const&,char>
                              ("%f%c",(float *)((long)paVar17 + lVar24),(char *)&va);
                    uVar19 = (ppVar1->second).
                             super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>
                             .nStored;
                    uVar10 = uVar10 + 1;
                    lVar24 = lVar24 + 4;
                  } while (uVar10 < uVar19);
                }
                ppVar2 = sorted.
                         super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish;
                sorted.
                super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
                ._M_impl.super__Vector_impl_data._M_finish = ppVar6;
              }
              sorted.
              super__Vector_base<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
              ._M_impl.super__Vector_impl_data._M_finish = ppVar2;
              std::
              vector<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>,_std::allocator<std::pair<pbrt::Point2<int>,_pbrt::ImageChannelValues>_>_>
              ::~vector(&sorted);
            }
            else if (bVar4) {
              v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.alloc.
              memoryResource._0_4_ = 1;
              va = (int)im.image.channelNames.nStored;
              if ((int)im.image.channelNames.nStored != 1) {
                pbrt::
                LogFatal<char_const(&)[18],char_const(&)[2],char_const(&)[18],int&,char_const(&)[2],int&>
                          (Fatal,
                           "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp"
                           ,0x1fe,"Check failed: %s == %s with %s = %s, %s = %s",
                           (char (*) [18])"image.NChannels()",(char (*) [2])0x2d6eb40,
                           (char (*) [18])"image.NChannels()",&va,(char (*) [2])0x2d6eb40,(int *)&v)
                ;
              }
              uVar19 = (ulong)uVar15 >> 0x20;
              if ((int)uVar23 < (int)uVar18) {
                TVar22.x = 0;
                TVar22.y = 0;
                do {
                  p_01 = TVar22;
                  iVar14 = uVar12 - iVar8;
                  if ((int)local_2c8 < (int)uVar12) {
                    do {
                      pbrt::Image::GetChannel(&im.image,(Point2i)p_01,0,(WrapMode2D)0x200000002);
                      printf("%f ");
                      p_01 = (Tuple2<pbrt::Point2,_int>)((long)p_01 + 1);
                      iVar14 = iVar14 + -1;
                    } while (iVar14 != 0);
                  }
                  putchar(10);
                  uVar23 = (int)uVar19 + 1;
                  uVar19 = (ulong)uVar23;
                  TVar22 = (Tuple2<pbrt::Point2,_int>)((long)TVar22 + 0x100000000);
                } while (uVar23 != uVar18);
              }
            }
            else {
              uVar19 = (ulong)uVar15 >> 0x20;
              local_2bc = uVar18;
              if ((int)uVar18 < (int)uVar23) {
                local_2bc = uVar23;
              }
              if ((iVar8 < (int)uVar12) && ((int)uVar23 < (int)uVar18)) {
                plVar13 = (long *)(uVar15 & 0xffffffff);
                plVar25 = (long *)uVar15;
                do {
                  p_00.super_Tuple2<pbrt::Point2,_int>.x = (int)plVar13 - (int)local_2c8;
                  p_00.super_Tuple2<pbrt::Point2,_int>.y = (int)uVar19 - uVar23;
                  pbrt::Image::GetChannels
                            ((ImageChannelValues *)&va,&im.image,p_00,(WrapMode2D)0x200000002);
                  if (!bVar5) {
                    printf("(%d, %d): ",(ulong)plVar13 & 0xffffffff,uVar19);
                  }
                  if (local_2d8 != 0) {
                    lVar24 = 0;
                    uVar19 = 0;
                    do {
                      pmVar16 = (memory_resource *)local_2f8._0_8_;
                      if ((memory_resource *)local_2f8._0_8_ == (memory_resource *)0x0) {
                        pmVar16 = (memory_resource *)(local_2f8 + 8);
                      }
                      uVar7 = 0x2c;
                      if (uVar19 == local_2d8 - 1) {
                        uVar7 = 10;
                      }
                      v.super_InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>.
                      alloc.memoryResource._0_1_ = uVar7;
                      pbrt::Printf<float&,char>
                                ("%f%c",(float *)((long)&pmVar16->_vptr_memory_resource + lVar24),
                                 (char *)&v);
                      uVar19 = uVar19 + 1;
                      lVar24 = lVar24 + 4;
                    } while (uVar19 < local_2d8);
                  }
                  local_2d8 = 0;
                  (**(code **)(*(long *)_va + 0x18))(_va,local_2f8._0_8_,local_2f8._24_8_ << 2,4);
                  uVar18 = (int)plVar13 + 1;
                  plVar13 = (long *)(((ulong)plVar25 & 0xffffffff00000000) + 0x100000000 |
                                    uVar15 & 0xffffffff);
                  if (uVar18 != uVar12) {
                    plVar13 = (long *)((ulong)plVar25 & 0xffffffff00000000 | (ulong)uVar18);
                  }
                  uVar19 = (ulong)plVar13 >> 0x20;
                  plVar25 = plVar13;
                } while (((int)local_2c8 != (int)plVar13) ||
                        (local_2bc != (uint)((ulong)plVar13 >> 0x20)));
              }
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
            ::~_Rb_tree(&im.metadata.stringVectors._M_t);
            if (im.metadata.colorSpace.set == true) {
              im.metadata.colorSpace.set = false;
            }
            if (im.metadata.MSE.set == true) {
              im.metadata.MSE.set = false;
            }
            if (im.metadata.samplesPerPixel.set == true) {
              im.metadata.samplesPerPixel.set = false;
            }
            if (im.metadata.fullResolution.set == true) {
              im.metadata.fullResolution.set = false;
            }
            if (im.metadata.pixelBounds.set == true) {
              im.metadata.pixelBounds.set = false;
            }
            if (im.metadata.NDCFromWorld.set == true) {
              im.metadata.NDCFromWorld.set = false;
            }
            if (im.metadata.cameraFromWorld.set == true) {
              im.metadata.cameraFromWorld.set = false;
            }
            if (im.metadata.renderTimeSeconds.set == true) {
              im.metadata.renderTimeSeconds.set = false;
            }
            im.image.p32.nStored = 0;
            (*(im.image.p32.alloc.memoryResource)->_vptr_memory_resource[3])
                      (im.image.p32.alloc.memoryResource,im.image.p32.ptr,im.image.p32.nAlloc << 2,4
                      );
            im.image.p16.nStored = 0;
            (*(im.image.p16.alloc.memoryResource)->_vptr_memory_resource[3])
                      (im.image.p16.alloc.memoryResource,im.image.p16.ptr,im.image.p16.nAlloc * 2,2)
            ;
            im.image.p8.nStored = 0;
            (*(im.image.p8.alloc.memoryResource)->_vptr_memory_resource[3])
                      (im.image.p8.alloc.memoryResource,im.image.p8.ptr,im.image.p8.nAlloc,1);
            pbrt::
            InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~InlinedVector(&im.image.channelNames);
          }
        }
      }
      uVar11 = uVar11 + 1;
      uVar23 = (uint)(uVar11 < (uint)argc);
    } while (uVar11 != (uint)argc);
  }
  return 0;
}

Assistant:

int cat(int argc, char *argv[]) {
    if (argc == 0)
        usage("cat", "no filenames provided to \"cat\"?");
    bool sort = false;
    bool csv = false;
    bool list = false;

    for (int i = 0; i < argc; ++i) {
        if (strcmp(argv[i], "--sort") == 0 || strcmp(argv[i], "-sort") == 0) {
            sort = !sort;
            continue;
        }
        if (strcmp(argv[i], "--csv") == 0 || strcmp(argv[i], "-csv") == 0) {
            csv = !csv;
            continue;
        }
        if (strcmp(argv[i], "--list") == 0 || strcmp(argv[i], "-list") == 0) {
            list = !list;
            continue;
        }

        if (sort && csv) {
            fprintf(stderr, "imgtool: --sort and --csv don't make sense to use "
                            "together.\n");
            return 1;
        }
        if (sort && list) {
            fprintf(stderr, "imgtool: --sort and --list don't make sense to "
                            "use together.\n");
            return 1;
        }

        ImageAndMetadata im = Image::Read(argv[i]);
        ImageMetadata &metadata = im.metadata;
        Image &image = im.image;

        Bounds2i pixelBounds =
            metadata.pixelBounds.value_or(Bounds2i({0, 0}, image.Resolution()));
        if (sort) {
            std::vector<std::pair<Point2i, ImageChannelValues>> sorted;
            sorted.reserve(pixelBounds.Area());
            for (Point2i p : pixelBounds) {
                ImageChannelValues v = image.GetChannels(
                    {p.x - pixelBounds.pMin.x, p.y - pixelBounds.pMin.y});
                sorted.push_back(std::make_pair(p, v));
            }

            std::sort(sorted.begin(), sorted.end(),
                      [](const std::pair<Point2i, ImageChannelValues> &a,
                         const std::pair<Point2i, ImageChannelValues> &b) {
                          return a.second.Average() < b.second.Average();
                      });
            for (const auto &v : sorted) {
                const ImageChannelValues &values = v.second;
                if (!csv)
                    printf("(%d, %d): ", v.first.x, v.first.y);
                for (size_t i = 0; i < values.size(); ++i)
                    Printf("%f%c", values[i], (i == values.size() - 1) ? '\n' : ',');
            }
        } else {
            if (list) {
                CHECK_EQ(image.NChannels(), 1);
                for (int y = pixelBounds.pMin.y; y < pixelBounds.pMax.y; ++y) {
                    for (int x = pixelBounds.pMin.x; x < pixelBounds.pMax.x; ++x)
                        printf("%f ",
                               image.GetChannel(
                                   {x - pixelBounds.pMin.x, y - pixelBounds.pMin.y}, 0));
                    printf("\n");
                }
            } else {
                for (Point2i p : pixelBounds) {
                    ImageChannelValues values = image.GetChannels(
                        {p.x - pixelBounds.pMin.x, p.y - pixelBounds.pMin.y});
                    if (!csv)
                        printf("(%d, %d): ", p.x, p.y);
                    for (size_t i = 0; i < values.size(); ++i)
                        Printf("%f%c", values[i], (i == values.size() - 1) ? '\n' : ',');
                }
            }
        }
    }
    return 0;
}